

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

void lablremap(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  t_symbol *ptVar4;
  t_symbol *ptVar5;
  
  iVar2 = bank_base;
  iVar1 = bank_limit;
  lVar3 = 0;
  do {
    for (ptVar4 = hash_tbl[lVar3]; ptVar4 != (t_symbol *)0x0; ptVar4 = ptVar4->next) {
      if (ptVar4->bank <= iVar1) {
        ptVar4->bank = ptVar4->bank + iVar2;
      }
      for (ptVar5 = ptVar4->local; ptVar5 != (t_symbol *)0x0; ptVar5 = ptVar5->next) {
        if (ptVar5->bank <= iVar1) {
          ptVar5->bank = ptVar5->bank + iVar2;
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void
lablremap(void)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	int i;

	/* browse the symbol table */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];
		while (sym) {
			/* remap the bank */
			if (sym->bank <= bank_limit)
				sym->bank += bank_base;

			/* local symbols */
			if (sym->local) {
				local = sym->local;

				while  (local) {
					if (local->bank <= bank_limit)
						local->bank += bank_base;

					/* next */
					local = local->next;
				}
			}

			/* next */
			sym = sym->next;
		}
	}
}